

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O1

void __thiscall
icu_63::UnifiedCache::_get
          (UnifiedCache *this,CacheKeyBase *key,SharedObject **value,void *creationContext,
          UErrorCode *status)

{
  SharedObject *this_00;
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = _poll(this,(pollfd *)key,(nfds_t)value,(int)status);
  if ((char)iVar1 == '\0') {
    if (U_ZERO_ERROR < *status) {
      return;
    }
    iVar1 = (*(key->super_UObject)._vptr_UObject[6])(key,creationContext,status);
    *value = (SharedObject *)CONCAT44(extraout_var,iVar1);
    if ((SharedObject *)CONCAT44(extraout_var,iVar1) == (SharedObject *)0x0) {
      SharedObject::copyPtr<icu_63::SharedObject>(this->fNoValue,value);
    }
    _putIfAbsentAndGet(this,key,value,status);
  }
  this_00 = *value;
  if ((this_00 != (SharedObject *)0x0) && (this_00 == this->fNoValue)) {
    SharedObject::removeRef(this_00);
    *value = (SharedObject *)0x0;
  }
  return;
}

Assistant:

void UnifiedCache::_get(
        const CacheKeyBase &key,
        const SharedObject *&value,
        const void *creationContext,
        UErrorCode &status) const {
    U_ASSERT(value == NULL);
    U_ASSERT(status == U_ZERO_ERROR);
    if (_poll(key, value, status)) {
        if (value == fNoValue) {
            SharedObject::clearPtr(value);
        }
        return;
    }
    if (U_FAILURE(status)) {
        return;
    }
    value = key.createObject(creationContext, status);
    U_ASSERT(value == NULL || value->hasHardReferences());
    U_ASSERT(value != NULL || status != U_ZERO_ERROR);
    if (value == NULL) {
        SharedObject::copyPtr(fNoValue, value);
    }
    _putIfAbsentAndGet(key, value, status);
    if (value == fNoValue) {
        SharedObject::clearPtr(value);
    }
}